

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_R8D;
  char_t in_R9B;
  char_t in_stack_00000008;
  size_t offset;
  ulong local_18;
  
  local_18 = this->bufsize;
  if (0x7fa < local_18) {
    local_18 = flush((xml_buffered_writer *)CONCAT44((int)__n,in_R8D));
  }
  this->buffer[local_18] = (char_t)__fd;
  this->buffer[local_18 + 1] = (char_t)__buf;
  this->buffer[local_18 + 2] = (char_t)__n;
  this->buffer[local_18 + 3] = (char_t)in_R8D;
  this->buffer[local_18 + 4] = in_R9B;
  this->buffer[local_18 + 5] = in_stack_00000008;
  this->bufsize = local_18 + 6;
  return (ssize_t)this;
}

Assistant:

void write(char_t d0, char_t d1, char_t d2, char_t d3, char_t d4, char_t d5)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 6) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			buffer[offset + 2] = d2;
			buffer[offset + 3] = d3;
			buffer[offset + 4] = d4;
			buffer[offset + 5] = d5;
			bufsize = offset + 6;
		}